

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

double Js::JavascriptMath::Random(ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *pJVar2;
  ThreadContext *pTVar3;
  double dVar4;
  double res;
  uint64 seed1;
  uint64 seed0;
  ScriptContext *scriptContext_local;
  
  seed0 = (uint64)scriptContext;
  pJVar2 = ScriptContext::GetLibrary(scriptContext);
  bVar1 = JavascriptLibrary::IsPRNGSeeded(pJVar2);
  if (bVar1) {
    pJVar2 = ScriptContext::GetLibrary((ScriptContext *)seed0);
    seed1 = JavascriptLibrary::GetRandSeed0(pJVar2);
    pJVar2 = ScriptContext::GetLibrary((ScriptContext *)seed0);
    res = (double)JavascriptLibrary::GetRandSeed1(pJVar2);
  }
  else {
    InitializeRandomSeeds(&seed1,(uint64 *)&res,(ScriptContext *)seed0);
    Output::Trace(PRNGPhase,L"[PRNG:%x] INIT %I64x %I64x\n",seed0,seed1,res);
    pJVar2 = ScriptContext::GetLibrary((ScriptContext *)seed0);
    JavascriptLibrary::SetIsPRNGSeeded(pJVar2,true);
    bVar1 = ScriptContext::ShouldPerformReplayAction((ScriptContext *)seed0);
    if (bVar1) {
      pTVar3 = ScriptContext::GetThreadContext((ScriptContext *)seed0);
      TTD::EventLog::ReplayExternalEntropyRandomEvent(pTVar3->TTDLog,&seed1,(uint64 *)&res);
    }
    else {
      bVar1 = ScriptContext::ShouldPerformRecordAction((ScriptContext *)seed0);
      if (bVar1) {
        pTVar3 = ScriptContext::GetThreadContext((ScriptContext *)seed0);
        TTD::EventLog::RecordExternalEntropyRandomEvent(pTVar3->TTDLog,seed1,(uint64)res);
      }
    }
  }
  Output::Trace(PRNGPhase,L"[PRNG:%x] SEED %I64x %I64x\n",seed0,seed1,res);
  Xorshift128plus(&seed1,(uint64 *)&res);
  pJVar2 = ScriptContext::GetLibrary((ScriptContext *)seed0);
  JavascriptLibrary::SetRandSeed0(pJVar2,seed1);
  pJVar2 = ScriptContext::GetLibrary((ScriptContext *)seed0);
  JavascriptLibrary::SetRandSeed1(pJVar2,(uint64)res);
  dVar4 = ConvertRandomSeedsToDouble(seed1,(uint64)res);
  Output::Trace(PRNGPhase,L"[PRNG:%x] RAND %I64x\n",seed0,dVar4);
  return dVar4;
}

Assistant:

double JavascriptMath::Random(ScriptContext *scriptContext)
        {
            JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(DirectMath_Random);
            uint64 seed0;
            uint64 seed1;

            if (!scriptContext->GetLibrary()->IsPRNGSeeded())
            {
                InitializeRandomSeeds(&seed0, &seed1, scriptContext);
#if DBG_DUMP
                OUTPUT_TRACE(Js::PRNGPhase, _u("[PRNG:%x] INIT %I64x %I64x\n"), scriptContext, seed0, seed1);
#endif
                scriptContext->GetLibrary()->SetIsPRNGSeeded(true);

#if ENABLE_TTD
                if(scriptContext->ShouldPerformReplayAction())
                {
                    scriptContext->GetThreadContext()->TTDLog->ReplayExternalEntropyRandomEvent(&seed0, &seed1);
                }
                else if(scriptContext->ShouldPerformRecordAction())
                {
                    scriptContext->GetThreadContext()->TTDLog->RecordExternalEntropyRandomEvent(seed0, seed1);
                }
                else
                {
                    ;
                }
#endif
            }
            else
            {
                seed0 = scriptContext->GetLibrary()->GetRandSeed0();
                seed1 = scriptContext->GetLibrary()->GetRandSeed1();
            }

#if DBG_DUMP
            OUTPUT_TRACE(Js::PRNGPhase, _u("[PRNG:%x] SEED %I64x %I64x\n"), scriptContext, seed0, seed1);
#endif

            Xorshift128plus(&seed0, &seed1);

            //update the seeds in script context
            scriptContext->GetLibrary()->SetRandSeed0(seed0);
            scriptContext->GetLibrary()->SetRandSeed1(seed1);

            double res = ConvertRandomSeedsToDouble(seed0, seed1);
#if DBG_DUMP
            OUTPUT_TRACE(Js::PRNGPhase, _u("[PRNG:%x] RAND %I64x\n"), scriptContext, *((uint64 *)&res));
#endif
            return res;
            JIT_HELPER_END(DirectMath_Random);
        }